

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O1

intptr_t __thiscall Lowerer::GetObjRefForBuiltInTarget(Lowerer *this,RegOpnd *regOpnd)

{
  code *pcVar1;
  bool bVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 *puVar4;
  ulong uVar5;
  
  iVar3 = (*this->m_func->m_scriptContextInfo->_vptr_ScriptContextInfo[0x1f])();
  uVar5 = (ulong)(regOpnd->m_sym->m_builtInIndex)._value;
  if (0x46 < uVar5) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x2f0a,"(index < Js::BuiltinFunction::Count)",
                       "Invalid built-in index on a call target marked as built-in");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
  }
  return CONCAT44(extraout_var,iVar3) + uVar5;
}

Assistant:

intptr_t
Lowerer::GetObjRefForBuiltInTarget(IR::RegOpnd * regOpnd)
{
    intptr_t mathFns = m_func->GetScriptContextInfo()->GetBuiltinFunctionsBaseAddr();
    Js::BuiltinFunction index = regOpnd->m_sym->m_builtInIndex;

    AssertMsg(index < Js::BuiltinFunction::Count, "Invalid built-in index on a call target marked as built-in");

    return mathFns + index;
}